

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

Am_Wrapper * find_start_node_proc(Am_Object *self)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object local_40 [8];
  Am_Object local_38 [8];
  Am_Value_List local_30 [8];
  Am_Value_List nodes;
  int rank;
  int parent;
  Am_Object *self_local;
  
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0xa3);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  if (iVar2 == iVar3) {
    self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
  }
  else {
    Am_Object::Get_Owner(local_40,(Am_Slot_Flags)self);
    Am_Object::Get_Sibling(local_38,(Am_Slot_Key)local_40,(ulong)NODES);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_38,0x82);
    Am_Value_List::Am_Value_List(local_30,pAVar4);
    Am_Object::~Am_Object(local_38);
    Am_Object::~Am_Object(local_40);
    bVar1 = Am_Value_List::Valid();
    if ((bVar1 & 1) == 0) {
      self_local = (Am_Object *)Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&Am_No_Object);
    }
    else {
      pAVar4 = (Am_Value *)Am_Value_List::Get_Nth((int)local_30);
      self_local = (Am_Object *)Am_Value::operator_cast_to_Am_Wrapper_(pAVar4);
    }
    Am_Value_List::~Am_Value_List(local_30);
  }
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Object_Formula(find_start_node)
{
  int parent = self.Get(Am_ITEM);
  int rank = self.Get(Am_RANK);
  if (parent == rank)
    return Am_No_Object;
  Am_Value_List nodes =
      self.Get_Owner().Get_Sibling(NODES).Get(Am_GRAPHICAL_PARTS);
  if (nodes.Valid())
    return nodes.Get_Nth(parent);
  else
    return Am_No_Object;
}